

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O3

uint32_t FastPForLib::Simple8b_Codec::Decompress
                   (uint64_t *input,uint32_t param_2,uint32_t *output,uint32_t outOffset,
                   uint32_t outCount)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar7 = outCount + outOffset;
  uVar1 = 0;
  if (outOffset < uVar7) {
    uVar1 = 0;
    do {
      uVar6 = input[uVar1];
      uVar1 = uVar1 + 1;
      if (uVar6 >> 0x3c == 0) {
        return uVar1;
      }
      uVar9 = uVar7 - outOffset;
      uVar8 = (uint)(uVar6 >> 0x20);
      uVar4 = uVar8 >> 0x1c;
      if (uVar4 == 0xf) {
        uVar8 = uVar8 & 0xfffffff;
        if (uVar9 <= uVar8) {
          uVar8 = uVar9;
        }
        for (; uVar8 != 0; uVar8 = uVar8 - 1) {
          uVar2 = (ulong)outOffset;
          outOffset = outOffset + 1;
          output[uVar2] = (uint32_t)uVar6;
        }
      }
      else {
        uVar2 = (ulong)*(uint *)(Simple8b_Codec_bitLength + (uVar6 >> 0x3c) * 4);
        if (*(uint *)(Simple8b_Codec_bitLength + (ulong)(uVar4 ^ 0xf) * 4) < uVar9) {
          uVar9 = *(uint *)(Simple8b_Codec_bitLength + (ulong)(uVar4 ^ 0xf) * 4);
        }
        uVar8 = ~(uint)(-1L << (uVar2 & 0x3f));
        if (uVar9 == 0) {
          uVar3 = 0;
        }
        else {
          uVar3 = 0;
          do {
            uVar5 = uVar6 >> (uVar2 & 0x3f);
            output[outOffset + uVar3] = (uint)uVar6 & uVar8;
            uVar10 = uVar5 >> (uVar2 & 0x3f);
            output[(ulong)outOffset + uVar3 + 1] = (uint)uVar5 & uVar8;
            uVar6 = uVar10 >> (uVar2 & 0x3f);
            output[(ulong)outOffset + uVar3 + 2] = (uint)uVar10 & uVar8;
            uVar5 = uVar6 >> (uVar2 & 0x3f);
            output[(ulong)outOffset + uVar3 + 3] = (uint)uVar6 & uVar8;
            uVar6 = uVar5 >> (uVar2 & 0x3f);
            output[(ulong)outOffset + uVar3 + 4] = (uint)uVar5 & uVar8;
            uVar10 = uVar6 >> (uVar2 & 0x3f);
            output[(ulong)outOffset + uVar3 + 5] = (uint)uVar6 & uVar8;
            uVar5 = uVar10 >> (uVar2 & 0x3f);
            output[(ulong)outOffset + uVar3 + 6] = (uint)uVar10 & uVar8;
            uVar6 = uVar5 >> (uVar2 & 0x3f);
            output[(ulong)outOffset + uVar3 + 7] = (uint)uVar5 & uVar8;
            uVar3 = uVar3 + 8;
          } while (uVar3 < uVar9);
        }
        if ((uint)uVar3 < uVar9) {
          uVar3 = uVar3 & 0xffffffff;
          do {
            uVar4 = (uint)uVar6;
            uVar6 = uVar6 >> (uVar2 & 0x3f);
            output[outOffset + uVar3] = uVar4 & uVar8;
            uVar3 = uVar3 + 1;
          } while (uVar9 != uVar3);
        }
        outOffset = outOffset + uVar9;
      }
    } while (outOffset < uVar7);
  }
  return uVar1;
}

Assistant:

static uint32_t Decompress(const uint64_t *input, uint32_t,
                             uint32_t *output, uint32_t outOffset,
                             uint32_t outCount) {
    uint32_t inPos = 0;
    uint32_t outPos = outOffset;
    uint32_t outEnd = outOffset + outCount;

    while (outPos < outEnd) {
      uint32_t remainingCount = outEnd - outPos;

      uint64_t val = input[inPos++];
      uint32_t code = static_cast<uint32_t>(val >> SIMPLE8B_BITSIZE);

      // optional check for end-of-stream
      if (code == 0) {
        break; // end of stream
      }

#if defined(_SIMPLE8B_USE_RLE)
      else if (code == SIMPLE8B_MAXCODE) {
        // decode rle-encoded integers
        uint32_t repeatValue = static_cast<uint32_t>(val & RLE_MAX_VALUE_MASK);
        uint32_t repeatCount = static_cast<uint32_t>(
            (val >> RLE_MAX_VALUE_BITS) & RLE_MAX_COUNT_MASK);
        repeatCount =
            (repeatCount < remainingCount) ? repeatCount : remainingCount;

        for (uint32_t i = 0; i < repeatCount; ++i) {
          output[outPos++] = repeatValue;
        }
      }
#endif
      else {
        // decode bit-packed integers
        uint32_t intNum = Simple8b_Codec_bitLength[SIMPLE8B_MAXCODE - code];
        uint32_t bitLen = Simple8b_Codec_bitLength[code];
        uint64_t bitMask = (1ULL << bitLen) - 1;
        intNum = (intNum < remainingCount)
                     ? intNum
                     : remainingCount; // optional buffer end check

#if defined(_DONT_UNROLL_LOOP)
        for (uint32_t i = 0; i < intNum; ++i) {
          output[outPos++] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
        }
#else
        uint32_t i = 0;
        for (; i < intNum; i += 8) {
          auto out = output + outPos + i;
          out[0] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[1] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[2] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[3] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[4] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[5] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[6] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[7] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
        }
        for (; i < intNum; ++i) {
          auto out = output + outPos + i;
          out[0] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
        }
        outPos += intNum;
#endif
      }
    }